

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool camp::test::array::data(void)

{
  pointer pvVar1;
  const_pointer pvVar2;
  bool bVar3;
  bool local_2b;
  bool passed;
  int *b_data;
  array<int,_2UL> *b;
  int *a_data;
  array<int,_2UL> a;
  
  a_data = (int *)0x800000001;
  pvVar1 = array<int,_2UL>::data((array<int,_2UL> *)&a_data);
  pvVar2 = array<int,_2UL>::data((array<int,_2UL> *)&a_data);
  bVar3 = false;
  if (((*pvVar1 == 1) && (bVar3 = false, pvVar1[1] == 8)) && (bVar3 = false, *pvVar2 == 1)) {
    bVar3 = pvVar2[1] == 8;
  }
  *pvVar1 = 3;
  local_2b = false;
  if (((bVar3) && (local_2b = false, *pvVar1 == 3)) &&
     ((local_2b = false, pvVar1[1] == 8 && (local_2b = false, *pvVar2 == 3)))) {
    local_2b = pvVar2[1] == 8;
  }
  return local_2b;
}

Assistant:

CAMP_TEST_BEGIN(array, data)
{
   camp::array<int, 2> a = {1, 8};
   int* a_data = a.data();

   const camp::array<int, 2>& b{a};
   const int* b_data = b.data();

   bool passed = a_data[0] == 1 &&
                 a_data[1] == 8 &&
                 b_data[0] == 1 &&
                 b_data[1] == 8;

   a_data[0] = 3;

   return passed &&
          a_data[0] == 3 &&
          a_data[1] == 8 &&
          b_data[0] == 3 &&
          b_data[1] == 8;
}